

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::SeekHead::Parse(SeekHead *this)

{
  IMkvReader *pReader;
  long lVar1;
  SeekHead *pSVar2;
  bool bVar3;
  long lVar4;
  Entry *pEVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long stop;
  longlong pos;
  longlong size;
  longlong id;
  long local_70;
  long local_68;
  VoidElement *local_60;
  ulong local_58;
  ulong local_50;
  SeekHead *local_48;
  long local_40;
  long local_38;
  
  pReader = this->m_pSegment->m_pReader;
  local_70 = this->m_start;
  stop = this->m_size + local_70;
  local_58 = 0;
  local_50 = 0;
  local_48 = this;
  do {
    pSVar2 = local_48;
    if (stop <= local_70) {
      if (local_70 != stop) {
        return -2;
      }
      if (0 < (long)local_50) {
        uVar8 = local_50 << 5;
        pEVar5 = (Entry *)operator_new__(-(ulong)(local_50 >> 0x3b != 0) | uVar8,
                                         (nothrow_t *)&std::nothrow);
        if (pEVar5 == (Entry *)0x0) {
          pSVar2->m_entries = (Entry *)0x0;
          return -1;
        }
        uVar7 = 0;
        do {
          Entry::Entry((Entry *)((long)&pEVar5->id + uVar7));
          uVar7 = uVar7 + 0x20;
        } while (uVar8 != uVar7);
        local_48->m_entries = pEVar5;
      }
      pSVar2 = local_48;
      if ((long)local_58 < 1) {
        local_60 = local_48->m_void_elements;
      }
      else {
        local_60 = (VoidElement *)
                   operator_new__(-(ulong)(local_58 >> 0x3c != 0) | local_58 << 4,
                                  (nothrow_t *)&std::nothrow);
        pSVar2->m_void_elements = local_60;
        if (local_60 == (VoidElement *)0x0) {
          return -1;
        }
      }
      lVar4 = pSVar2->m_start;
      pEVar5 = pSVar2->m_entries;
      while( true ) {
        if (stop <= lVar4) {
          if (lVar4 == stop) {
            local_48->m_entry_count = (int)((ulong)((long)pEVar5 - (long)local_48->m_entries) >> 5);
            local_48->m_void_element_count =
                 (int)((ulong)((long)local_60 - (long)local_48->m_void_elements) >> 4);
            return 0;
          }
          return -2;
        }
        local_70 = lVar4;
        lVar6 = ParseElementHeader(pReader,&local_70,stop,&local_40,&local_68);
        lVar1 = local_70;
        if (lVar6 < 0) break;
        if (local_40 == 0x4dbb && 0 < (long)local_50) {
          local_38 = local_68;
          bVar3 = ParseEntry(pReader,local_70,local_68,pEVar5);
          lVar6 = local_38;
          if (bVar3) {
            pEVar5->element_start = lVar4;
            pEVar5->element_size = (lVar1 - lVar4) + local_38;
            pEVar5 = pEVar5 + 1;
          }
        }
        else {
          lVar6 = local_68;
          if (0 < (long)local_58 && local_40 == 0xec) {
            local_60->element_start = lVar4;
            local_60->element_size = (local_70 - lVar4) + local_68;
            local_60 = local_60 + 1;
            lVar6 = local_68;
          }
        }
        lVar4 = lVar1 + lVar6;
        if (stop < lVar4) {
          return -2;
        }
      }
      return lVar6;
    }
    lVar4 = ParseElementHeader(pReader,&local_70,stop,&local_40,&local_68);
    if (lVar4 < 0) {
      return lVar4;
    }
    if (local_40 == 0xec) {
      if (0x7ffffffe < (long)local_58) {
        return -1;
      }
      local_58 = local_58 + 1;
    }
    else if (local_40 == 0x4dbb) {
      if (0x7ffffffe < (long)local_50) {
        return -1;
      }
      local_50 = local_50 + 1;
    }
    local_70 = local_70 + local_68;
  } while (local_70 <= stop);
  return -2;
}

Assistant:

long SeekHead::Parse() {
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = m_start;
  const long long stop = m_start + m_size;

  // first count the seek head entries

  long long entry_count = 0;
  long long void_element_count = 0;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSeek) {
      ++entry_count;
      if (entry_count > INT_MAX)
        return E_PARSE_FAILED;
    } else if (id == libwebm::kMkvVoid) {
      ++void_element_count;
      if (void_element_count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload

    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  if (entry_count > 0) {
    m_entries = new (std::nothrow) Entry[static_cast<size_t>(entry_count)];

    if (m_entries == NULL)
      return -1;
  }

  if (void_element_count > 0) {
    m_void_elements =
        new (std::nothrow) VoidElement[static_cast<size_t>(void_element_count)];

    if (m_void_elements == NULL)
      return -1;
  }

  // now parse the entries and void elements

  Entry* pEntry = m_entries;
  VoidElement* pVoidElement = m_void_elements;

  pos = m_start;

  while (pos < stop) {
    const long long idpos = pos;

    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSeek && entry_count > 0) {
      if (ParseEntry(pReader, pos, size, pEntry)) {
        Entry& e = *pEntry++;

        e.element_start = idpos;
        e.element_size = (pos + size) - idpos;
      }
    } else if (id == libwebm::kMkvVoid && void_element_count > 0) {
      VoidElement& e = *pVoidElement++;

      e.element_start = idpos;
      e.element_size = (pos + size) - idpos;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  ptrdiff_t count_ = ptrdiff_t(pEntry - m_entries);
  assert(count_ >= 0);
  assert(static_cast<long long>(count_) <= entry_count);

  m_entry_count = static_cast<int>(count_);

  count_ = ptrdiff_t(pVoidElement - m_void_elements);
  assert(count_ >= 0);
  assert(static_cast<long long>(count_) <= void_element_count);

  m_void_element_count = static_cast<int>(count_);

  return 0;
}